

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnReader::ReadPageHeaders
          (ColumnReader *this,idx_t max_read,optional_ptr<const_duckdb::TableFilter,_true> filter,
          optional_ptr<duckdb::TableFilterState,_true> filter_state)

{
  ulong uVar1;
  
  while (uVar1 = this->page_rows_available, uVar1 == 0) {
    PrepareRead(this,filter,filter_state);
  }
  if (max_read < uVar1) {
    uVar1 = max_read;
  }
  if (0x7ff < uVar1) {
    uVar1 = 0x800;
  }
  return uVar1;
}

Assistant:

idx_t ColumnReader::ReadPageHeaders(idx_t max_read, optional_ptr<const TableFilter> filter,
                                    optional_ptr<TableFilterState> filter_state) {
	while (page_rows_available == 0) {
		PrepareRead(filter, filter_state);
	}
	return MinValue<idx_t>(MinValue<idx_t>(max_read, page_rows_available), STANDARD_VECTOR_SIZE);
}